

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O1

void jinit_merged_upsampler(j_decompress_ptr cinfo)

{
  long lVar1;
  int iVar2;
  jpeg_upsampler *pjVar3;
  void *pvVar4;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var5;
  _func_void_j_decompress_ptr *p_Var6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  pjVar3 = (jpeg_upsampler *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x58);
  cinfo->upsample = pjVar3;
  pjVar3->start_pass = start_pass_merged_upsample;
  pjVar3->need_context_rows = 0;
  iVar2 = cinfo->out_color_components * cinfo->output_width;
  *(int *)((long)&pjVar3[3].start_pass + 4) = iVar2;
  if (cinfo->max_v_samp_factor == 2) {
    pjVar3->upsample = merged_2v_upsample;
    pjVar3[1].start_pass = h2v2_merged_upsample;
    pvVar4 = (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,(size_t)iVar2);
  }
  else {
    pjVar3->upsample = merged_1v_upsample;
    pjVar3[1].start_pass = h2v1_merged_upsample;
    pvVar4 = (void *)0x0;
  }
  *(void **)&pjVar3[2].need_context_rows = pvVar4;
  pjVar3 = cinfo->upsample;
  p_Var5 = (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
            *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x400);
  pjVar3[1].upsample = p_Var5;
  pvVar4 = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x400);
  *(void **)&pjVar3[1].need_context_rows = pvVar4;
  p_Var6 = (_func_void_j_decompress_ptr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x800);
  pjVar3[2].start_pass = p_Var6;
  p_Var7 = (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
            *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x800);
  pjVar3[2].upsample = p_Var7;
  p_Var5 = pjVar3[1].upsample;
  lVar1 = *(long *)&pjVar3[1].need_context_rows;
  p_Var6 = pjVar3[2].start_pass;
  lVar8 = 0x2c8d00;
  lVar9 = 0x5b6900;
  lVar10 = -0xe25100;
  lVar11 = -0xb2f480;
  lVar12 = 0;
  do {
    *(int *)(p_Var5 + lVar12) = (int)((ulong)lVar11 >> 0x10);
    *(int *)(lVar1 + lVar12) = (int)((ulong)lVar10 >> 0x10);
    *(long *)(p_Var6 + lVar12 * 2) = lVar9;
    *(long *)(p_Var7 + lVar12 * 2) = lVar8;
    lVar12 = lVar12 + 4;
    lVar8 = lVar8 + -0x581a;
    lVar9 = lVar9 + -0xb6d2;
    lVar10 = lVar10 + 0x1c5a2;
    lVar11 = lVar11 + 0x166e9;
  } while (lVar12 != 0x400);
  return;
}

Assistant:

GLOBAL(void)
jinit_merged_upsampler (j_decompress_ptr cinfo)
{
  my_upsample_ptr upsample;

  upsample = (my_upsample_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_upsampler));
  cinfo->upsample = (struct jpeg_upsampler *) upsample;
  upsample->pub.start_pass = start_pass_merged_upsample;
  upsample->pub.need_context_rows = FALSE;

  upsample->out_row_width = cinfo->output_width * cinfo->out_color_components;

  if (cinfo->max_v_samp_factor == 2) {
    upsample->pub.upsample = merged_2v_upsample;
    upsample->upmethod = h2v2_merged_upsample;
    /* Allocate a spare row buffer */
    upsample->spare_row = (JSAMPROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr) cinfo, JPOOL_IMAGE,
		(size_t) (upsample->out_row_width * SIZEOF(JSAMPLE)));
  } else {
    upsample->pub.upsample = merged_1v_upsample;
    upsample->upmethod = h2v1_merged_upsample;
    /* No spare row needed */
    upsample->spare_row = NULL;
  }

  build_ycc_rgb_table(cinfo);
}